

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O2

PAL_ERROR InternalSetFilePointerForUnixFd
                    (int iUnixFd,LONG lDistanceToMove,PLONG lpDistanceToMoveHigh,DWORD dwMoveMethod,
                    PLONG lpNewFilePointerLow)

{
  int iVar1;
  __off64_t __offset;
  __off64_t _Var2;
  int *piVar3;
  PAL_ERROR PVar4;
  long __offset_00;
  undefined1 local_d0 [8];
  stat fileData;
  
  if (2 < dwMoveMethod) {
    if (PAL_InitializeChakraCoreCalled) {
      return 0x57;
    }
    goto LAB_002d65d6;
  }
  if (lpDistanceToMoveHigh == (PLONG)0x0) {
    __offset_00 = (long)lDistanceToMove;
  }
  else {
    __offset_00 = CONCAT44(*lpDistanceToMoveHigh,lDistanceToMove);
  }
  __offset = lseek64(iUnixFd,0,1);
  if (__offset == -1) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_002d65d6;
    piVar3 = __errno_location();
    strerror(*piVar3);
LAB_002d6592:
    PVar4 = 5;
  }
  else {
    if ((dwMoveMethod == 0) && (__offset_00 < 0)) {
      return 0x83;
    }
    if ((dwMoveMethod == 1) && (__offset + __offset_00 < 0)) {
      return 0x83;
    }
    fileData.__glibc_reserved[2] = (__syscall_slong_t)lpNewFilePointerLow;
    if ((dwMoveMethod == 2) && (__offset_00 < 0)) {
      iVar1 = fstat64(iUnixFd,(stat64 *)local_d0);
      if (iVar1 == -1) goto LAB_002d6592;
      if (SBORROW8(fileData.st_rdev,-__offset_00) != (long)(fileData.st_rdev + __offset_00) < 0) {
        return 0x83;
      }
    }
    _Var2 = lseek64(iUnixFd,__offset_00,dwMoveMethod);
    if (_Var2 < 0) {
      if (PAL_InitializeChakraCoreCalled == false) {
LAB_002d65d6:
        abort();
      }
      PVar4 = 5;
      piVar3 = __errno_location();
      strerror(*piVar3);
      lseek64(iUnixFd,__offset,0);
    }
    else {
      if (lpDistanceToMoveHigh != (PLONG)0x0) {
        *lpDistanceToMoveHigh = (LONG)((ulong)_Var2 >> 0x20);
      }
      *(int *)fileData.__glibc_reserved[2] = (int)_Var2;
      PVar4 = 0;
    }
  }
  return PVar4;
}

Assistant:

PAL_ERROR
InternalSetFilePointerForUnixFd(
    int iUnixFd,
    LONG lDistanceToMove,
    PLONG lpDistanceToMoveHigh,
    DWORD dwMoveMethod,
    PLONG lpNewFilePointerLow
    )
{
    PAL_ERROR palError = NO_ERROR;
    int     seek_whence = 0;
    __int64 seek_offset = 0LL;
    __int64 seek_res = 0LL;
    off_t old_offset;

    switch( dwMoveMethod )
    {
    case FILE_BEGIN:
        seek_whence = SEEK_SET; 
        break;
    case FILE_CURRENT:
        seek_whence = SEEK_CUR; 
        break;
    case FILE_END:
        seek_whence = SEEK_END; 
        break;
    default:
        ERROR("dwMoveMethod = %d is invalid\n", dwMoveMethod);
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    //
    // According to MSDN, if lpDistanceToMoveHigh is not null, 
    // lDistanceToMove is treated as unsigned; 
    // it is treated as signed otherwise
    //
    
    if ( lpDistanceToMoveHigh )
    {
        /* set the high 32 bits of the offset */
        seek_offset = ((__int64)*lpDistanceToMoveHigh << 32);
        
        /* set the low 32 bits */
        /* cast to unsigned long to avoid sign extension */
        seek_offset |= (ULONG) lDistanceToMove;
    }
    else
    {
        seek_offset |= lDistanceToMove;
    }

    /* store the current position, in case the lseek moves the pointer
       before the beginning of the file */
    old_offset = lseek(iUnixFd, 0, SEEK_CUR);
    if (old_offset == -1)
    {
        ERROR("lseek(fd,0,SEEK_CUR) failed errno:%d (%s)\n", 
              errno, strerror(errno));
        palError = ERROR_ACCESS_DENIED;
        goto done;
    }
    
    // Check to see if we're going to seek to a negative offset.
    // If we're seeking from the beginning or the current mark,
    // this is simple.
    if ((seek_whence == SEEK_SET && seek_offset < 0) ||
        (seek_whence == SEEK_CUR && seek_offset + old_offset < 0))
    {
        palError = ERROR_NEGATIVE_SEEK;
        goto done;
    }
    else if (seek_whence == SEEK_END && seek_offset < 0)
    {
        // We need to determine if we're seeking past the
        // beginning of the file, but we don't want to adjust
        // the mark in the process. stat is the only way to
        // do that.
        struct stat fileData;
        int result;
        
        result = fstat(iUnixFd, &fileData);
        if (result == -1)
        {
            // It's a bad fd. This shouldn't happen because
            // we've already called lseek on it, but you
            // never know. This is the best we can do.
            palError = ERROR_ACCESS_DENIED;
            goto done;
        }
        if (fileData.st_size < -seek_offset)
        {
            // Seeking past the beginning.
            palError = ERROR_NEGATIVE_SEEK;
            goto done;
        }
    }

    seek_res = (__int64)lseek( iUnixFd,
                               seek_offset,
                               seek_whence );
    if ( seek_res < 0 )
    {
        /* lseek() returns -1 on error, but also can seek to negative
           file offsets, so -1 can also indicate a successful seek to offset
           -1.  Win32 doesn't allow negative file offsets, so either case
           is an error. */
        ERROR("lseek failed errno:%d (%s)\n", errno, strerror(errno));
        lseek(iUnixFd, old_offset, SEEK_SET);
        palError = ERROR_ACCESS_DENIED;
    }
    else
    {
        /* store high-order DWORD */
        if ( lpDistanceToMoveHigh )
            *lpDistanceToMoveHigh = (DWORD)(seek_res >> 32);
    
        /* return low-order DWORD of seek result */
        *lpNewFilePointerLow = (DWORD)seek_res;
    }

done:

    return palError;
}